

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void walLimitSize(Wal *pWal,i64 nMax)

{
  int iErrCode;
  i64 sz;
  long local_20;
  
  if (sqlite3Hooks_0 != (code *)0x0) {
    (*sqlite3Hooks_0)();
  }
  iErrCode = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,&local_20);
  if ((iErrCode == 0) && (iErrCode = 0, nMax < local_20)) {
    iErrCode = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,nMax);
  }
  if (sqlite3Hooks_1 != (code *)0x0) {
    (*sqlite3Hooks_1)();
  }
  if (iErrCode != 0) {
    sqlite3_log(iErrCode,"cannot limit WAL size: %s",pWal->zWalName);
  }
  return;
}

Assistant:

static void walLimitSize(Wal *pWal, i64 nMax){
  i64 sz;
  int rx;
  sqlite3BeginBenignMalloc();
  rx = sqlite3OsFileSize(pWal->pWalFd, &sz);
  if( rx==SQLITE_OK && (sz > nMax ) ){
    rx = sqlite3OsTruncate(pWal->pWalFd, nMax);
  }
  sqlite3EndBenignMalloc();
  if( rx ){
    sqlite3_log(rx, "cannot limit WAL size: %s", pWal->zWalName);
  }
}